

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qktxhandler.cpp
# Opt level: O3

ssize_t __thiscall QKtxHandler::read(QKtxHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  Data *pDVar1;
  qsizetype qVar2;
  quint32 qVar3;
  int *piVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  QLoggingCategory *pQVar11;
  char *pcVar12;
  undefined4 in_register_00000034;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  quint32 end;
  uint offset;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView view;
  QByteArrayView QVar17;
  QTextureFileData texData;
  int local_dc;
  QTextureFileData local_d0;
  undefined1 local_c8 [4];
  Representation RStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  QByteArray local_a8;
  undefined1 local_88 [20];
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  view.m_size = (QKtxHandler *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((view.m_size)->super_QTextureFileHandler).m_device == (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      return (ssize_t)this;
    }
    goto LAB_0053d151;
  }
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  qVar2 = local_a8.d.size;
  pcVar12 = local_a8.d.ptr;
  if ((ulong)local_a8.d.size >> 0x20 == 0) {
    QVar16.m_data = local_a8.d.ptr;
    QVar16.m_size = local_a8.d.size;
    QVar17.m_data = ktxIdentifier;
    QVar17.m_size = 0xc;
    cVar5 = QtPrivate::startsWith(QVar16,QVar17);
    if (cVar5 == '\0') {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        uStack_60 = pQVar11->name;
        local_88._16_4_ = 2;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar12 == (char *)0x0) {
            pcVar12 = (char *)&QByteArray::_empty;
          }
          pcVar13 = "Invalid KTX file %s";
          goto LAB_0053cbf1;
        }
        read((int)pDVar1,pcVar12,(size_t)(local_88 + 0x10));
      }
      goto LAB_0053c891;
    }
    if ((ulong)qVar2 < (undefined1 *)0x40) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        uStack_60 = pQVar11->name;
        local_88._16_4_ = 2;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar12 == (char *)0x0) {
            pcVar12 = (char *)&QByteArray::_empty;
          }
          pcVar13 = "Invalid KTX header size in %s";
          goto LAB_0053cbf1;
        }
        read((int)pDVar1,pcVar12,(size_t)(local_88 + 0x10));
      }
      goto LAB_0053c891;
    }
    if (pcVar12 == (storage_type *)0x0) {
      pcVar12 = (char *)&QByteArray::_empty;
    }
    uStack_60 = *(char **)(pcVar12 + 0x18);
    local_58 = *(undefined8 *)(pcVar12 + 0x20);
    uStack_50 = *(undefined8 *)(pcVar12 + 0x28);
    local_48 = *(undefined8 *)(pcVar12 + 0x30);
    uStack_40 = *(undefined8 *)(pcVar12 + 0x38);
    uStack_68 = (undefined4)*(undefined8 *)(pcVar12 + 0x10);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(pcVar12 + 0x10) >> 0x20);
    local_88._16_4_ = (undefined4)*(undefined8 *)pcVar12;
    uStack_74 = (undefined4)((ulong)*(undefined8 *)pcVar12 >> 0x20);
    uStack_70 = (undefined4)*(undefined8 *)(pcVar12 + 8);
    uStack_6c = (undefined4)((ulong)*(undefined8 *)(pcVar12 + 8) >> 0x20);
    bVar6 = checkHeader(view.m_size,(KTXHeader *)(local_88 + 0x10));
    if (!bVar6) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_b0 = pQVar11->name;
        local_c8 = (undefined1  [4])0x2;
        RStack_c4.m_i = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        uStack_b8 = 0;
        uStack_b4 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar12 == (char *)0x0) {
            pcVar12 = (char *)&QByteArray::_empty;
          }
          pcVar13 = "Unsupported KTX file format in %s";
          pcVar14 = local_c8;
          goto LAB_0053cbf6;
        }
        read((int)pDVar1,pcVar12,(size_t)local_c8);
      }
      goto LAB_0053c891;
    }
    local_d0.d.d.ptr = (QSharedDataPointer<QTextureFileDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextureFileData::QTextureFileData(&local_d0,ByteArrayMode);
    QTextureFileData::setData(&local_d0,&local_a8);
    uVar8 = local_58._4_4_;
    uVar15 = (uint)uStack_50;
    bVar6 = (view.m_size)->inverseEndian == false;
    local_c8 = (undefined1  [4])
               (local_58._4_4_ >> 0x18 | (local_58._4_4_ & 0xff0000) >> 8 |
                (local_58._4_4_ & 0xff00) << 8 | local_58._4_4_ << 0x18);
    if (bVar6) {
      local_c8 = (undefined1  [4])local_58._4_4_;
    }
    RStack_c4.m_i =
         (uint)uStack_50 >> 0x18 | ((uint)uStack_50 & 0xff0000) >> 8 |
         ((uint)uStack_50 & 0xff00) << 8 | (uint)uStack_50 << 0x18;
    if (bVar6) {
      RStack_c4.m_i = (uint)uStack_50;
    }
    QTextureFileData::setSize(&local_d0,(QSize *)local_c8);
    qVar3 = (uint)uStack_60 >> 0x18 | ((uint)uStack_60 & 0xff0000) >> 8 |
            ((uint)uStack_60 & 0xff00) << 8 | (uint)uStack_60 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = (uint)uStack_60;
    }
    QTextureFileData::setGLFormat(&local_d0,qVar3);
    qVar3 = uStack_60._4_4_ >> 0x18 | (uStack_60._4_4_ & 0xff0000) >> 8 |
            (uStack_60._4_4_ & 0xff00) << 8 | uStack_60._4_4_ << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = uStack_60._4_4_;
    }
    QTextureFileData::setGLInternalFormat(&local_d0,qVar3);
    qVar3 = (uint)local_58 >> 0x18 | ((uint)local_58 & 0xff0000) >> 8 |
            ((uint)local_58 & 0xff00) << 8 | (uint)local_58 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = (uint)local_58;
    }
    QTextureFileData::setGLBaseInternalFormat(&local_d0,qVar3);
    uVar7 = (uint)uStack_40 >> 0x18 | ((uint)uStack_40 & 0xff0000) >> 8 |
            ((uint)uStack_40 & 0xff00) << 8 | (uint)uStack_40 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar7 = (uint)uStack_40;
    }
    QTextureFileData::setNumLevels(&local_d0,uVar7);
    uVar7 = local_48._4_4_ >> 0x18 | (local_48._4_4_ & 0xff0000) >> 8 |
            (local_48._4_4_ & 0xff00) << 8 | local_48._4_4_ << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar7 = local_48._4_4_;
    }
    QTextureFileData::setNumFaces(&local_d0,uVar7);
    uVar7 = uStack_40._4_4_ >> 0x18 | (uStack_40._4_4_ & 0xff0000) >> 8 |
            (uStack_40._4_4_ & 0xff00) << 8 | uStack_40._4_4_ << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar7 = uStack_40._4_4_;
    }
    offset = uVar7 + 0x40;
    if (uVar7 < 0xffffffc0) {
      if ((uint)local_a8.d.size <= offset) {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_b0 = pQVar11->name;
          local_c8 = (undefined1  [4])0x2;
          RStack_c4.m_i = 0;
          uStack_c0 = 0;
          uStack_bc = 0;
          uStack_b8 = 0;
          uStack_b4 = 0;
          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          if (pDVar1 == (Data *)0x0) {
LAB_0053cb7d:
            if (pcVar12 == (char *)0x0) {
              pcVar12 = (char *)&QByteArray::_empty;
            }
            pcVar13 = "OOB request in KTX file %s";
            goto LAB_0053ccef;
          }
          read((int)pDVar1,pcVar12,(size_t)local_c8);
        }
        goto LAB_0053d0ed;
      }
      if (uVar7 == 0) {
LAB_0053cc5f:
        if (uVar15 < uVar8) {
          uVar15 = uVar8;
        }
        if (uVar15 < uStack_50._4_4_) {
          uVar15 = uStack_50._4_4_;
        }
        uVar8 = 0x20;
        if (uVar15 != 0) {
          uVar8 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = uVar8 ^ 0x1f;
        }
        iVar9 = QTextureFileData::numLevels(&local_d0);
        if ((int)(0x20 - uVar8) < iVar9) {
          pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
          if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            local_b0 = pQVar11->name;
            local_c8 = (undefined1  [4])0x2;
            RStack_c4.m_i = 0;
            uStack_c0 = 0;
            uStack_bc = 0;
            uStack_b8 = 0;
            uStack_b4 = 0;
            pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
            pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
            if (pDVar1 == (Data *)0x0) {
              if (pcVar12 == (char *)0x0) {
                pcVar12 = (char *)&QByteArray::_empty;
              }
              pcVar13 = "Too many levels in KTX file %s";
LAB_0053ccef:
              uStack_b8 = 0;
              uStack_bc = 0;
              uStack_c0 = 0;
              RStack_c4.m_i = 0;
              uStack_b4 = 0;
              local_c8 = (undefined1  [4])0x2;
              QMessageLogger::warning(local_c8,pcVar13,pcVar12);
            }
            else {
              read((int)pDVar1,pcVar12,(size_t)local_c8);
            }
          }
        }
        else {
          iVar9 = QTextureFileData::numFaces(&local_d0);
          if ((iVar9 == 1) || (iVar9 = QTextureFileData::numFaces(&local_d0), iVar9 == 6)) {
            iVar9 = QTextureFileData::numLevels(&local_d0);
            if (0 < iVar9) {
              local_dc = 0;
              do {
                uVar15 = offset + 4;
                if ((0xfffffffb < offset) || ((uint)local_a8.d.size < uVar15)) {
                  pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                  if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
                  goto LAB_0053d0ed;
                  local_b0 = pQVar11->name;
                  local_c8 = (undefined1  [4])0x2;
                  RStack_c4.m_i = 0;
                  uStack_c0 = 0;
                  uStack_bc = 0;
                  uStack_b8 = 0;
                  uStack_b4 = 0;
                  pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                  pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                  if (pDVar1 == (Data *)0x0) goto LAB_0053cb7d;
                  read((int)pDVar1,pcVar12,(size_t)local_c8);
                  goto LAB_0053d0ed;
                }
                uVar8 = *(uint *)(local_a8.d.ptr + offset);
                uVar7 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18;
                if ((view.m_size)->inverseEndian == false) {
                  uVar7 = uVar8;
                }
                iVar9 = QTextureFileData::numFaces(&local_d0);
                offset = uVar15;
                if (0 < iVar9) {
                  uVar15 = uVar7 + 3 & 0xfffffffc;
                  iVar9 = 0;
                  do {
                    QTextureFileData::setDataOffset(&local_d0,offset,local_dc,iVar9);
                    QTextureFileData::setDataLength(&local_d0,uVar7,local_dc,iVar9);
                    if (0xfffffffc < uVar7) {
                      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
                      goto LAB_0053d0ed;
                      local_b0 = pQVar11->name;
                      local_c8 = (undefined1  [4])0x2;
                      RStack_c4.m_i = 0;
                      uStack_c0 = 0;
                      uStack_bc = 0;
                      uStack_b8 = 0;
                      uStack_b4 = 0;
                      pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                      pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                      if (pDVar1 != (Data *)0x0) {
                        read((int)pDVar1,pcVar12,(size_t)local_c8);
                        goto LAB_0053d0ed;
                      }
                      if (pcVar12 == (char *)0x0) {
                        pcVar12 = (char *)&QByteArray::_empty;
                      }
                      pcVar13 = "Overflow in KTX file %s";
                      goto LAB_0053ccef;
                    }
                    bVar6 = CARRY4(offset,uVar15);
                    offset = offset + uVar15;
                    if (bVar6) {
                      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
                      goto LAB_0053d0ed;
                      local_b0 = pQVar11->name;
                      local_c8 = (undefined1  [4])0x2;
                      RStack_c4.m_i = 0;
                      uStack_c0 = 0;
                      uStack_bc = 0;
                      uStack_b8 = 0;
                      uStack_b4 = 0;
                      pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                      pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                      if (pDVar1 == (Data *)0x0) goto LAB_0053cb7d;
                      read((int)pDVar1,pcVar12,(size_t)local_c8);
                      goto LAB_0053d0ed;
                    }
                    iVar9 = iVar9 + 1;
                    iVar10 = QTextureFileData::numFaces(&local_d0);
                  } while (iVar9 < iVar10);
                }
                local_dc = local_dc + 1;
                iVar9 = QTextureFileData::numLevels(&local_d0);
              } while (local_dc < iVar9);
            }
            bVar6 = QTextureFileData::isValid(&local_d0);
            if (bVar6) {
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              local_c8 = SUB84(pDVar1,0);
              RStack_c4.m_i = (int)((ulong)pDVar1 >> 0x20);
              pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              uStack_c0 = SUB84(pcVar12,0);
              uStack_bc = (undefined4)((ulong)pcVar12 >> 0x20);
              qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
              uStack_b8 = (undefined4)qVar2;
              uStack_b4 = (undefined4)((ulong)qVar2 >> 0x20);
              if (pDVar1 != (Data *)0x0) {
                LOCK();
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              QTextureFileData::setLogName(&local_d0,(QByteArray *)local_c8);
              piVar4 = (int *)CONCAT44(RStack_c4.m_i,local_c8);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  QArrayData::deallocate((QArrayData *)CONCAT44(RStack_c4.m_i,local_c8),1,0x10);
                }
              }
              QTextureFileData::QTextureFileData((QTextureFileData *)this,&local_d0);
              goto LAB_0053d0f7;
            }
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_b0 = pQVar11->name;
              local_c8 = (undefined1  [4])0x2;
              RStack_c4.m_i = 0;
              uStack_c0 = 0;
              uStack_bc = 0;
              uStack_b8 = 0;
              uStack_b4 = 0;
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              if (pDVar1 == (Data *)0x0) {
                if (pcVar12 == (char *)0x0) {
                  pcVar12 = (char *)&QByteArray::_empty;
                }
                pcVar13 = "Invalid values in header of KTX file %s";
                goto LAB_0053ccef;
              }
              read((int)pDVar1,pcVar12,(size_t)local_c8);
            }
          }
          else {
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_b0 = pQVar11->name;
              local_c8 = (undefined1  [4])0x2;
              RStack_c4.m_i = 0;
              uStack_c0 = 0;
              uStack_bc = 0;
              uStack_b8 = 0;
              uStack_b4 = 0;
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              if (pDVar1 == (Data *)0x0) {
                if (pcVar12 == (char *)0x0) {
                  pcVar12 = (char *)&QByteArray::_empty;
                }
                pcVar13 = "Invalid number of faces in KTX file %s";
                goto LAB_0053ccef;
              }
              read((int)pDVar1,pcVar12,(size_t)local_c8);
            }
          }
        }
        goto LAB_0053d0ed;
      }
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      view.m_data._0_4_ = uVar7;
      view.m_data._4_4_ = 0;
      decodeKeyValues((QKtxHandler *)local_88,view);
      cVar5 = local_88[8];
      if (local_88[8] == '\0') {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_b0 = pQVar11->name;
          local_c8 = (undefined1  [4])0x2;
          RStack_c4.m_i = 0;
          uStack_c0 = 0;
          uStack_bc = 0;
          uStack_b8 = 0;
          uStack_b4 = 0;
          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          if (pDVar1 == (Data *)0x0) {
            if (pcVar12 == (char *)0x0) {
              pcVar12 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::warning(local_c8,"Could not parse key values in KTX file %s",pcVar12);
          }
          else {
            read((int)pDVar1,pcVar12,(size_t)local_c8);
          }
        }
        QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      }
      else {
        QTextureFileData::setKeyValueMetadata(&local_d0,(QMap<QByteArray,_QByteArray> *)local_88);
      }
      if (local_88[8] == '\x01') {
        local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                    *)local_88);
      }
      if (cVar5 != '\0') {
        uVar8 = local_58._4_4_;
        uVar15 = (uint)uStack_50;
        goto LAB_0053cc5f;
      }
    }
    else {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_b0 = pQVar11->name;
        local_c8 = (undefined1  [4])0x2;
        RStack_c4.m_i = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        uStack_b8 = 0;
        uStack_b4 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar12 == (char *)0x0) {
            pcVar12 = (char *)&QByteArray::_empty;
          }
          pcVar13 = "Overflow in size of key value data in header of KTX file %s";
          goto LAB_0053ccef;
        }
        read((int)pDVar1,pcVar12,(size_t)local_c8);
      }
LAB_0053d0ed:
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
    }
LAB_0053d0f7:
    QTextureFileData::~QTextureFileData(&local_d0);
  }
  else {
    pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
    if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      uStack_60 = pQVar11->name;
      local_88._16_4_ = 2;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
      pcVar12 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
      if (pDVar1 == (Data *)0x0) {
        if (pcVar12 == (char *)0x0) {
          pcVar12 = (char *)&QByteArray::_empty;
        }
        pcVar13 = "Too big KTX file %s";
LAB_0053cbf1:
        uStack_64 = 0;
        uStack_68 = 0;
        uStack_6c = 0;
        uStack_70 = 0;
        uStack_74 = 0;
        local_88._16_4_ = 2;
        pcVar14 = local_88 + 0x10;
LAB_0053cbf6:
        QMessageLogger::warning(pcVar14,pcVar13,pcVar12);
      }
      else {
        read((int)pDVar1,pcVar12,(size_t)(local_88 + 0x10));
      }
    }
LAB_0053c891:
    QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ssize_t)this;
  }
LAB_0053d151:
  __stack_chk_fail();
}

Assistant:

QTextureFileData QKtxHandler::read()
{
    if (!device())
        return QTextureFileData();

    const QByteArray buf = device()->readAll();
    if (static_cast<size_t>(buf.size()) > std::numeric_limits<quint32>::max()) {
        qCWarning(lcQtGuiTextureIO, "Too big KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (!canRead(QByteArray(), buf)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (buf.size() < qsizetype(qktxh_headerSize)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX header size in %s", logName().constData());
        return QTextureFileData();
    }

    KTXHeader header;
    memcpy(&header, buf.data(), qktxh_headerSize);
    if (!checkHeader(header)) {
        qCWarning(lcQtGuiTextureIO, "Unsupported KTX file format in %s", logName().constData());
        return QTextureFileData();
    }

    QTextureFileData texData;
    texData.setData(buf);

    texData.setSize(QSize(decode(header.pixelWidth), decode(header.pixelHeight)));
    texData.setGLFormat(decode(header.glFormat));
    texData.setGLInternalFormat(decode(header.glInternalFormat));
    texData.setGLBaseInternalFormat(decode(header.glBaseInternalFormat));

    texData.setNumLevels(decode(header.numberOfMipmapLevels));
    texData.setNumFaces(decode(header.numberOfFaces));

    const quint32 bytesOfKeyValueData = decode(header.bytesOfKeyValueData);
    quint32 headerKeyValueSize;
    if (qAddOverflow(qktxh_headerSize, bytesOfKeyValueData, &headerKeyValueSize)) {
        qCWarning(lcQtGuiTextureIO, "Overflow in size of key value data in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    if (headerKeyValueSize >= quint32(buf.size())) {
        qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    // File contains key/values
    if (bytesOfKeyValueData > 0) {
        auto keyValueDataView = safeView(buf, qktxh_headerSize, bytesOfKeyValueData);
        if (keyValueDataView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "Invalid view in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        auto keyValues = decodeKeyValues(keyValueDataView);
        if (!keyValues) {
            qCWarning(lcQtGuiTextureIO, "Could not parse key values in KTX file %s",
                     logName().constData());
            return QTextureFileData();
        }

        texData.setKeyValueMetadata(*keyValues);
    }

    // Technically, any number of levels is allowed but if the value is bigger than
    // what is possible in KTX V2 (and what makes sense) we return an error.
    // maxLevels = log2(max(width, height, depth))
    const int maxLevels = (sizeof(quint32) * 8)
            - qCountLeadingZeroBits(std::max(
                    { header.pixelWidth, header.pixelHeight, header.pixelDepth }));

    if (texData.numLevels() > maxLevels) {
        qCWarning(lcQtGuiTextureIO, "Too many levels in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (texData.numFaces() != 1 && texData.numFaces() != 6) {
        qCWarning(lcQtGuiTextureIO, "Invalid number of faces in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    quint32 offset = headerKeyValueSize;
    for (int level = 0; level < texData.numLevels(); level++) {
        const auto imageSizeView = safeView(buf, offset, sizeof(quint32));
        if (imageSizeView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        const quint32 imageSize = decode(qFromUnaligned<quint32>(imageSizeView.data()));
        offset += sizeof(quint32); // overflow checked indirectly above

        for (int face = 0; face < texData.numFaces(); face++) {
            texData.setDataOffset(offset, level, face);
            texData.setDataLength(imageSize, level, face);

            // Add image data and padding to offset
            const auto padded = nearestMultipleOf4(imageSize);
            if (!padded) {
                qCWarning(lcQtGuiTextureIO, "Overflow in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            quint32 offsetNext;
            if (qAddOverflow(offset, *padded, &offsetNext)) {
                qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            offset = offsetNext;
        }
    }

    if (!texData.isValid()) {
        qCWarning(lcQtGuiTextureIO, "Invalid values in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    texData.setLogName(logName());

#ifdef KTX_DEBUG
    qDebug() << "KTX file handler read" << texData;
#endif

    return texData;
}